

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::toZigZag(LossyDctEncoderBase *this,half *dst,half *src)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    dst->_h = src[*(int *)((long)L"8ccccc/Bcccccccccccccccccccccccccccccccccccccc" + lVar1 + 0xb8)].
              _h;
    dst = dst + 1;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

void 
DwaCompressor::LossyDctEncoderBase::toZigZag (half *dst, half *src) 
{
    const int remap[] =
    {
         0, 
         1,  8,
        16,  9,  2,
         3, 10, 17, 24,
        32, 25, 18, 11, 4,
         5, 12, 19, 26, 33, 40,
        48, 41, 34, 27, 20, 13, 6,
         7, 14, 21, 28, 35, 42, 49, 56,
            57, 50, 43, 36, 29, 22, 15,
                23, 30, 37, 44, 51, 58,
                    59, 52, 45, 38, 31,
                        39, 46, 53, 60,
                            61, 54, 47,
                                55, 62,
                                    63
    };

    for (int i=0; i<64; ++i)
        dst[i] = src[remap[i]];
}